

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

_Bool rf_check_collision_ray_sphere(rf_ray ray,rf_vec3 center,float radius)

{
  float fVar1;
  float fVar2;
  rf_vec3 v;
  float d;
  float vector;
  float distance;
  rf_vec3 ray_sphere_pos;
  _Bool collision;
  float radius_local;
  rf_vec3 center_local;
  
  v = rf_vec3_sub(center,ray.position);
  fVar1 = rf_vec3_len(v);
  fVar2 = rf_vec3_dot_product(v,ray.direction);
  return 0.0 <= radius * radius + -(fVar1 * fVar1 + -(fVar2 * fVar2));
}

Assistant:

RF_API bool rf_check_collision_ray_sphere(rf_ray ray, rf_vec3 center, float radius)
{
    bool collision = false;

    rf_vec3 ray_sphere_pos = rf_vec3_sub(center, ray.position);
    float distance = rf_vec3_len(ray_sphere_pos);
    float vector = rf_vec3_dot_product(ray_sphere_pos, ray.direction);
    float d = radius * radius - (distance * distance - vector * vector);

    if (d >= 0.0f) collision = true;

    return collision;
}